

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O3

FunctionType * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::FunctionType,LLVMBC::LLVMContext&,LLVMBC::Type*&,std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>>
          (LLVMContext *this,LLVMContext *u,Type **u_1,
          vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *u_2)

{
  Type *return_type_;
  FunctionType *this_00;
  Vector<Type_*> local_48;
  
  this_00 = (FunctionType *)allocate(this,0x30,8);
  if (this_00 != (FunctionType *)0x0) {
    return_type_ = *u_1;
    local_48.super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (u_2->super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>).
         _M_impl.super__Vector_impl_data._M_start;
    local_48.super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (u_2->super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (u_2->super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>).
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    (u_2->super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (u_2->super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (u_2->super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    FunctionType::FunctionType(this_00,u,return_type_,&local_48);
    if (local_48.super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      ::dxil_spv::free_in_thread
                (local_48.
                 super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
    append_typed_destructor<LLVMBC::FunctionType>(this,this_00);
    return this_00;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}